

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ManSetCioIds(Aig_Man_t *p)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    lVar1 = 0;
    do {
      *(int *)pVVar2->pArray[lVar1] = (int)lVar1;
      lVar1 = lVar1 + 1;
      pVVar2 = p->vCis;
    } while (lVar1 < pVVar2->nSize);
  }
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    lVar1 = 0;
    do {
      *(int *)pVVar2->pArray[lVar1] = (int)lVar1;
      lVar1 = lVar1 + 1;
      pVVar2 = p->vCos;
    } while (lVar1 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Aig_ManSetCioIds( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachCi( p, pObj, i )
        pObj->CioId = i;
    Aig_ManForEachCo( p, pObj, i )
        pObj->CioId = i;
}